

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprVectorSize(Expr *pExpr)

{
  u8 uVar1;
  Select *pSVar2;
  
  uVar1 = pExpr->op;
  if (uVar1 == 0xa8) {
    uVar1 = pExpr->op2;
  }
  if (uVar1 == 0x83) {
    pSVar2 = (pExpr->x).pSelect;
  }
  else {
    if (uVar1 != 0xa9) {
      return 1;
    }
    pSVar2 = (Select *)&pExpr->x;
  }
  return ((anon_union_8_2_a01b6dbf_for_x *)&pSVar2->pEList)->pList->nExpr;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprVectorSize(Expr *pExpr){
  u8 op = pExpr->op;
  if( op==TK_REGISTER ) op = pExpr->op2;
  if( op==TK_VECTOR ){
    return pExpr->x.pList->nExpr;
  }else if( op==TK_SELECT ){
    return pExpr->x.pSelect->pEList->nExpr;
  }else{
    return 1;
  }
}